

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int nghttp2_stream_dep_insert(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_stream *pnStack_28;
  int rv;
  nghttp2_stream *si;
  nghttp2_stream *stream_local;
  nghttp2_stream *dep_stream_local;
  
  stream->sum_dep_weight = dep_stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;
  if (dep_stream->dep_next != (nghttp2_stream *)0x0) {
    for (pnStack_28 = dep_stream->dep_next; pnStack_28 != (nghttp2_stream *)0x0;
        pnStack_28 = pnStack_28->sib_next) {
      pnStack_28->dep_prev = stream;
      if ((pnStack_28->queued != '\0') &&
         (iVar1 = stream_obq_move(stream,dep_stream,pnStack_28), iVar1 != 0)) {
        return iVar1;
      }
    }
    iVar1 = stream_subtree_active(stream);
    if ((iVar1 != 0) && (iVar1 = stream_obq_push(dep_stream,stream), iVar1 != 0)) {
      return iVar1;
    }
    stream->dep_next = dep_stream->dep_next;
  }
  dep_stream->dep_next = stream;
  stream->dep_prev = dep_stream;
  validate_tree(stream);
  return 0;
}

Assistant:

int nghttp2_stream_dep_insert(nghttp2_stream *dep_stream,
                              nghttp2_stream *stream) {
  nghttp2_stream *si;
  int rv;

  DEBUGF("stream: dep_insert dep_stream(%p)=%d, stream(%p)=%d\n", dep_stream,
         dep_stream->stream_id, stream, stream->stream_id);

  stream->sum_dep_weight = dep_stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;

  if (dep_stream->dep_next) {
    for (si = dep_stream->dep_next; si; si = si->sib_next) {
      si->dep_prev = stream;
      if (si->queued) {
        rv = stream_obq_move(stream, dep_stream, si);
        if (rv != 0) {
          return rv;
        }
      }
    }

    if (stream_subtree_active(stream)) {
      rv = stream_obq_push(dep_stream, stream);
      if (rv != 0) {
        return rv;
      }
    }

    stream->dep_next = dep_stream->dep_next;
  }

  dep_stream->dep_next = stream;
  stream->dep_prev = dep_stream;

  validate_tree(stream);

  return 0;
}